

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O3

void intgemm::anon_unknown_0::TestMultiplyShiftNonShift<intgemm::AVX2::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  UnquantizeAndAddBiasAndWrite callback_01;
  size_t __i;
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  ulong size;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  AlignedVector<float> A;
  AlignedVector<float> test_C;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<signed_char> B_prep;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> A_prep_old;
  AlignedVector<unsigned_char> A_prep;
  ostringstream info;
  mt19937 gen;
  AlignedVector<float> local_1640;
  AlignedVector<float> local_1630;
  AlignedVector<float> local_1620;
  AlignedVector<float> local_1610;
  float local_1600;
  float local_15fc;
  float local_15f8;
  float local_15f4;
  AlignedVector<signed_char> local_15f0;
  AlignedVector<float> local_15e0;
  AlignedVector<float> local_15d0;
  AlignedVector<signed_char> local_15c0;
  AlignedVector<unsigned_char> local_15b0;
  ulong local_15a0;
  undefined4 local_1598;
  undefined4 uStack_1594;
  float *pfStack_1590;
  float *local_1588;
  undefined4 local_1580;
  undefined4 uStack_157c;
  float *pfStack_1578;
  float *local_1570;
  undefined4 local_1568;
  undefined4 uStack_1564;
  float *pfStack_1560;
  float *local_1558;
  string local_1550;
  ostringstream local_1530 [112];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_1600 = int_tolerance;
  local_15fc = float_tolerance;
  local_15f8 = MSE_float_tolerance;
  local_15f4 = MSE_int_tolerance;
  std::__cxx11::ostringstream::ostringstream(local_1530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"8-bit AVX2",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"\t",1);
  local_15a0 = (ulong)A_rows;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1530);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_13b8,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_13b8,1);
  size = (ulong)B_cols;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_13b8._M_x[0] = CONCAT71(local_13b8._M_x[0]._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_13b8,1);
  AlignedVector<float>::AlignedVector(&local_1640,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&local_1610,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&local_1620,size,0x40);
  pfVar4 = local_1640.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13b8._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_1640.size_ != 0) {
    lVar8 = local_1640.size_ << 2;
    lVar2 = 0;
    do {
      fVar10 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar4 + lVar2) = fVar10 + fVar10 + -1.0;
      lVar2 = lVar2 + 4;
    } while (lVar8 != lVar2);
  }
  pfVar4 = local_1610.mem_;
  if (local_1610.size_ != 0) {
    lVar8 = local_1610.size_ << 2;
    lVar2 = 0;
    do {
      fVar10 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar4 + lVar2) = fVar10 + fVar10 + -1.0;
      lVar2 = lVar2 + 4;
    } while (lVar8 != lVar2);
  }
  if (local_1620.size_ != 0) {
    memset(local_1620.mem_,0,local_1620.size_ << 2);
  }
  AlignedVector<unsigned_char>::AlignedVector(&local_15b0,local_1640.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&local_15c0,local_1640.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&local_15f0,local_1610.size_,0x40);
  AVX2::Kernels8::PrepareA(local_1640.mem_,local_15b0.mem_,63.5,A_rows,width);
  AVX2::Kernels8::PrepareA(local_1640.mem_,local_15c0.mem_,63.5,A_rows,width);
  AVX2::Kernels8::PrepareB(local_1610.mem_,local_15f0.mem_,63.5,width,B_cols);
  AlignedVector<float>::AlignedVector(&local_1630,(ulong)(B_cols * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&local_15d0,local_1630.size_,0x40);
  local_1568 = 0x39820610;
  pfStack_1560 = local_1620.mem_;
  local_1558 = local_15d0.mem_;
  callback._4_4_ = uStack_1564;
  callback.unquant_mult = 0.0002480005;
  callback.bias_addr = local_1620.mem_;
  callback.output_addr = local_15d0.mem_;
  AVX2::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_15c0.mem_,local_15f0.mem_,A_rows,width,B_cols,callback);
  AlignedVector<float>::AlignedVector(&local_15e0,local_1630.size_,0x40);
  if (A_rows != 0) {
    uVar3 = 0;
    pfVar4 = local_1640.mem_;
    do {
      if (B_cols != 0) {
        uVar7 = 0;
        pfVar6 = local_1610.mem_;
        do {
          if (width == 0) {
            fVar10 = 0.0;
          }
          else {
            fVar10 = 0.0;
            uVar9 = 0;
            pfVar5 = pfVar6;
            do {
              fVar10 = fVar10 + *pfVar5 * pfVar4[uVar9];
              uVar9 = uVar9 + 1;
              pfVar5 = pfVar5 + size;
            } while (width != uVar9);
          }
          local_15e0.mem_[uVar3 * size + uVar7] = fVar10 + local_1620.mem_[uVar7];
          uVar7 = uVar7 + 1;
          pfVar6 = pfVar6 + 1;
        } while (uVar7 != size);
      }
      uVar3 = uVar3 + 1;
      pfVar4 = pfVar4 + width;
    } while (uVar3 != local_15a0);
  }
  local_1580 = 0xbd010204;
  pfStack_1578 = local_1620.mem_;
  local_1570 = local_1620.mem_;
  callback_00._4_4_ = uStack_157c;
  callback_00.unquant_mult = -0.031496063;
  callback_00.bias_addr = local_1620.mem_;
  callback_00.output_addr = local_1620.mem_;
  AVX2::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_15f0.mem_,width,B_cols,callback_00);
  local_1598 = 0x39820610;
  pfStack_1590 = local_1620.mem_;
  local_1588 = local_1630.mem_;
  callback_01._4_4_ = uStack_1594;
  callback_01.unquant_mult = 0.0002480005;
  callback_01.bias_addr = local_1620.mem_;
  callback_01.output_addr = local_1630.mem_;
  AVX2::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_15b0.mem_,local_15f0.mem_,A_rows,width,B_cols,callback_01);
  pfVar5 = local_15d0.mem_;
  pfVar6 = local_15e0.mem_;
  pfVar4 = local_1630.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar6,pfVar5,pfVar4,local_1630.size_,&local_1550,local_1600,local_15fc,local_15f8,
             local_15f4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  free(local_15e0.mem_);
  free(local_15d0.mem_);
  free(local_1630.mem_);
  free(local_15f0.mem_);
  free(local_15c0.mem_);
  free(local_15b0.mem_);
  free(local_1620.mem_);
  free(local_1610.mem_);
  free(local_1640.mem_);
  std::__cxx11::ostringstream::~ostringstream(local_1530);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

void TestMultiplyShiftNonShift(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference non shift multiplication instead of slowint
   */
  AlignedVector<float> slowint_C(test_C.size());
  Routine::Multiply(A_prep_old.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), slowint_C.begin()));

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  /*
   * Multiply8 shift multiplication
   */
  float unquant_mult_forprep = (-1.0f)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}